

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::DateTruncBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  char cVar4;
  uint uVar5;
  reference pvVar6;
  pointer pEVar7;
  type pEVar8;
  reference pvVar9;
  undefined **ppuVar10;
  function_statistics_t p_Var11;
  NotImplementedException *pNVar12;
  DatePartSpecifier type;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  string part_name;
  Value part_value;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  ClientContext local_68 [24];
  char local_50;
  
  pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar6);
  cVar4 = (**(code **)(*(long *)pEVar7 + 0x78))(pEVar7);
  if (cVar4 == '\0') {
    *(undefined8 *)this = 0;
  }
  else {
    pvVar6 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar6);
    duckdb::ExpressionExecutor::EvaluateScalar(local_68,(Expression *)context,SUB81(pEVar8,0));
    if (local_50 == '\x01') {
      *(undefined8 *)this = 0;
    }
    else {
      duckdb::Value::ToString_abi_cxx11_();
      uVar5 = duckdb::GetDatePartSpecifier((string *)local_88);
      type = (DatePartSpecifier)uVar5;
      if ((type < BEGIN_INVALID) && ((0x83f83fU >> (uVar5 & 0x1f) & 1) != 0)) {
        pvVar9 = vector<duckdb::LogicalType,_true>::operator[]
                           ((vector<duckdb::LogicalType,_true> *)&bound_function->field_0x48,1);
        if (*pvVar9 == (value_type)0xf) {
          std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
          operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                    &bound_function->function,DateTruncFunction<duckdb::date_t,duckdb::date_t>);
          if ((JULIAN_DAY < type) || ((0xc3ffffU >> (uVar5 & 0x1f) & 1) == 0)) {
            pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            local_b8 = &uStack_a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,"Specifier type not implemented for DATETRUNC statistics"
                       ,"");
            duckdb::NotImplementedException::NotImplementedException(pNVar12,(string *)&local_b8);
            __cxa_throw(pNVar12,&NotImplementedException::typeinfo,
                        std::runtime_error::~runtime_error);
          }
          ppuVar10 = &
                     PTR_PropagateDateTruncStatistics<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::YearOperator>_008986d8
          ;
        }
        else {
          if (*pvVar9 != (value_type)0x13) {
            pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            local_b8 = &uStack_a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,"Temporal argument type for DATETRUNC","");
            duckdb::NotImplementedException::NotImplementedException(pNVar12,(string *)&local_b8);
            __cxa_throw(pNVar12,&NotImplementedException::typeinfo,
                        std::runtime_error::~runtime_error);
          }
          std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
          operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                    &bound_function->function,DateTruncFunction<duckdb::timestamp_t,duckdb::date_t>)
          ;
          if ((JULIAN_DAY < type) || ((0xc3ffffU >> (uVar5 & 0x1f) & 1) == 0)) {
            pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            local_b8 = &uStack_a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,"Specifier type not implemented for DATETRUNC statistics"
                       ,"");
            duckdb::NotImplementedException::NotImplementedException(pNVar12,(string *)&local_b8);
            __cxa_throw(pNVar12,&NotImplementedException::typeinfo,
                        std::runtime_error::~runtime_error);
          }
          ppuVar10 = &
                     PTR_PropagateDateTruncStatistics<duckdb::timestamp_t,duckdb::date_t,duckdb::DateTrunc::YearOperator>_00898618
          ;
        }
        bound_function->statistics = (function_statistics_t)ppuVar10[(char)type];
        duckdb::LogicalType::LogicalType((LogicalType *)&local_b8,DATE);
        uVar3 = uStack_a8;
        uVar2 = local_b0;
        bound_function->field_0x90 = local_b8._0_1_;
        bound_function->field_0x91 = local_b8._1_1_;
        uVar13 = *(undefined4 *)&bound_function->field_0x98;
        uVar15 = *(undefined4 *)&bound_function->field_0xa0;
        *(undefined8 *)&bound_function->field_0x98 = 0;
        *(undefined8 *)&bound_function->field_0xa0 = 0;
        local_b0 = 0;
        uStack_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&bound_function->field_0xa0;
        *(undefined8 *)&bound_function->field_0x98 = uVar2;
        *(undefined8 *)&bound_function->field_0xa0 = uVar3;
        uVar14 = *(undefined4 *)&bound_function->field_0x9c;
        uVar16 = *(undefined4 *)&bound_function->field_0xa4;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_98 = uVar13;
          uStack_94 = *(undefined4 *)&bound_function->field_0x9c;
          uStack_90 = uVar15;
          uStack_8c = *(undefined4 *)&bound_function->field_0xa4;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
          uVar13 = local_98;
          uVar14 = uStack_94;
          uVar15 = uStack_90;
          uVar16 = uStack_8c;
        }
        p_Var1 = uStack_a8;
        local_b0 = CONCAT44(uVar14,uVar13);
        uStack_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uVar16,uVar15);
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        }
        duckdb::LogicalType::~LogicalType((LogicalType *)&local_b8);
      }
      else {
        pvVar9 = vector<duckdb::LogicalType,_true>::operator[]
                           ((vector<duckdb::LogicalType,_true> *)&bound_function->field_0x48,1);
        if (*pvVar9 == (value_type)0xf) {
          p_Var11 = __duckdb__DateTruncStats<duckdb::date_t,duckdb::timestamp_t>_duckdb__DatePartSpecifier__
                              (type);
        }
        else {
          if (*pvVar9 != (value_type)0x13) {
            pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            local_b8 = &uStack_a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b8,"Temporal argument type for DATETRUNC","");
            duckdb::NotImplementedException::NotImplementedException(pNVar12,(string *)&local_b8);
            __cxa_throw(pNVar12,&NotImplementedException::typeinfo,
                        std::runtime_error::~runtime_error);
          }
          p_Var11 = __duckdb__DateTruncStats<duckdb::timestamp_t,duckdb::timestamp_t>_duckdb__DatePartSpecifier__
                              (type);
        }
        bound_function->statistics = p_Var11;
      }
      *(undefined8 *)this = 0;
      if (local_88[0] != local_78) {
        operator_delete(local_88[0]);
      }
    }
    duckdb::Value::~Value((Value *)local_68);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> DateTruncBind(ClientContext &context, ScalarFunction &bound_function,
                                              vector<unique_ptr<Expression>> &arguments) {
	if (!arguments[0]->IsFoldable()) {
		return nullptr;
	}

	// Rebind to return a date if we are truncating that far
	Value part_value = ExpressionExecutor::EvaluateScalar(context, *arguments[0]);
	if (part_value.IsNull()) {
		return nullptr;
	}
	const auto part_name = part_value.ToString();
	const auto part_code = GetDatePartSpecifier(part_name);
	switch (part_code) {
	case DatePartSpecifier::MILLENNIUM:
	case DatePartSpecifier::CENTURY:
	case DatePartSpecifier::DECADE:
	case DatePartSpecifier::YEAR:
	case DatePartSpecifier::QUARTER:
	case DatePartSpecifier::MONTH:
	case DatePartSpecifier::WEEK:
	case DatePartSpecifier::YEARWEEK:
	case DatePartSpecifier::ISOYEAR:
	case DatePartSpecifier::DAY:
	case DatePartSpecifier::DOW:
	case DatePartSpecifier::ISODOW:
	case DatePartSpecifier::DOY:
	case DatePartSpecifier::JULIAN_DAY:
		switch (bound_function.arguments[1].id()) {
		case LogicalType::TIMESTAMP:
			bound_function.function = DateTruncFunction<timestamp_t, date_t>;
			bound_function.statistics = DateTruncStats<timestamp_t, date_t>(part_code);
			break;
		case LogicalType::DATE:
			bound_function.function = DateTruncFunction<date_t, date_t>;
			bound_function.statistics = DateTruncStats<date_t, date_t>(part_code);
			break;
		default:
			throw NotImplementedException("Temporal argument type for DATETRUNC");
		}
		bound_function.return_type = LogicalType::DATE;
		break;
	default:
		switch (bound_function.arguments[1].id()) {
		case LogicalType::TIMESTAMP:
			bound_function.statistics = DateTruncStats<timestamp_t, timestamp_t>(part_code);
			break;
		case LogicalType::DATE:
			bound_function.statistics = DateTruncStats<date_t, timestamp_t>(part_code);
			break;
		default:
			throw NotImplementedException("Temporal argument type for DATETRUNC");
		}
		break;
	}

	return nullptr;
}